

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrep.c
# Opt level: O0

void nn_xrep_rm(nn_sockbase *self,nn_pipe *pipe)

{
  nn_hash *self_00;
  nn_pipe *in_RSI;
  nn_hash_item *in_RDI;
  nn_xrep_data *data;
  nn_xrep *xrep;
  
  if (in_RDI == (nn_hash_item *)0x0) {
    in_RDI = (nn_hash_item *)0x0;
  }
  self_00 = (nn_hash *)nn_pipe_getdata(in_RSI);
  nn_fq_rm((nn_fq *)self_00,(nn_fq_data *)in_RDI);
  nn_hash_erase(self_00,in_RDI);
  nn_hash_item_term((nn_hash_item *)0x12f8cd);
  nn_free((void *)0x12f8d7);
  return;
}

Assistant:

void nn_xrep_rm (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xrep *xrep;
    struct nn_xrep_data *data;

    xrep = nn_cont (self, struct nn_xrep, sockbase);
    data = nn_pipe_getdata (pipe);

    nn_fq_rm (&xrep->inpipes, &data->initem);
    nn_hash_erase (&xrep->outpipes, &data->outitem);
    nn_hash_item_term (&data->outitem);

    nn_free (data);
}